

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmulqdq_tpl.h
# Opt level: O0

uint32_t crc32_fold_vpclmulqdq_final(crc32_fold *crc)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [8];
  __m128i *in_RDI;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  __m128i crc_fold;
  __m128i x_tmp2;
  __m128i x_tmp1;
  __m128i x_tmp0;
  __m128i xmm_crc3;
  __m128i xmm_crc2;
  __m128i xmm_crc1;
  __m128i xmm_crc0;
  __m128i xmm_mask2;
  __m128i xmm_mask;
  ulong local_268;
  ulong uStack_260;
  ulong local_258;
  ulong uStack_250;
  ulong local_248;
  ulong uStack_240;
  undefined1 local_238 [8];
  ulong uStack_230;
  ulong local_228;
  ulong uStack_220;
  ulong local_218;
  ulong uStack_210;
  __m128i local_208;
  uint local_1f8 [2];
  uint auStack_1f0 [2];
  uint local_1e8 [2];
  uint auStack_1e0 [2];
  __m128i *local_1d8;
  uint *local_1b8;
  uint *local_1b0;
  
  local_1b0 = crc_mask;
  local_1e8[0] = 0xffffffff;
  local_1e8[1] = 0xffffffff;
  auStack_1e0[0] = 0;
  auStack_1e0[1] = 0;
  local_1b8 = crc_mask2;
  local_1f8[0] = 0;
  local_1f8[1] = 0xffffffff;
  auStack_1f0[0] = 0xffffffff;
  auStack_1f0[1] = 0xffffffff;
  local_1d8 = in_RDI;
  crc32_fold_load(in_RDI,&local_208,(__m128i *)&local_218,(__m128i *)&local_228,(__m128i *)local_238
                 );
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_208[0];
  auVar17 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar16 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar17 = auVar17 ^ ZEXT816((ulong)0x1751997d0) << uVar1;
    }
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_208[1];
  auVar16 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar4 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar16 = auVar16 ^ ZEXT816((ulong)0xccaa009e) << uVar1;
    }
  }
  local_248 = auVar17._0_8_;
  uStack_240 = auVar17._8_8_;
  local_208[0] = auVar16._0_8_;
  local_208[1] = auVar16._8_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_218 ^ local_248 ^ local_208[0];
  auVar17 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar7 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar17 = auVar17 ^ ZEXT816((ulong)0x1751997d0) << uVar1;
    }
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uStack_210 ^ uStack_240 ^ local_208[1];
  auVar16 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar5 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar16 = auVar16 ^ ZEXT816((ulong)0xccaa009e) << uVar1;
    }
  }
  local_258 = auVar17._0_8_;
  uStack_250 = auVar17._8_8_;
  local_218 = auVar16._0_8_;
  uStack_210 = auVar16._8_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_228 ^ local_258 ^ local_218;
  auVar17 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar8 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar17 = auVar17 ^ ZEXT816((ulong)0x1751997d0) << uVar1;
    }
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uStack_220 ^ uStack_250 ^ uStack_210;
  auVar16 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar6 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar16 = auVar16 ^ ZEXT816((ulong)0xccaa009e) << uVar1;
    }
  }
  local_268 = auVar17._0_8_;
  uStack_260 = auVar17._8_8_;
  local_228 = auVar16._0_8_;
  uStack_220 = auVar16._8_8_;
  local_208[0] = (ulong)local_238 ^ local_268 ^ local_228;
  local_208[1] = uStack_230 ^ uStack_260 ^ uStack_220;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_208[0];
  auVar17 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar2 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar17 = auVar17 ^ ZEXT816((ulong)0xccaa009e) << uVar1;
    }
  }
  auVar16 = vpsrldq_avx((undefined1  [16])local_208,8);
  local_238 = auVar17._0_8_;
  uStack_230 = auVar17._8_8_;
  local_208[0] = auVar16._0_8_;
  local_208[1] = auVar16._8_8_;
  local_208[0] = (ulong)local_238 ^ local_208[0];
  uVar11 = uStack_230 ^ local_208[1];
  uStack_230 = uVar11;
  local_238 = (undefined1  [8])local_208[0];
  auVar17 = vpslldq_avx((undefined1  [16])_local_238,4);
  local_238 = auVar17._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_238;
  auVar17 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar9 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar17 = auVar17 ^ ZEXT816((ulong)0x163cd6124) << uVar1;
    }
  }
  local_238 = auVar17._0_8_;
  uStack_230 = auVar17._8_8_;
  auVar14._8_8_ = uStack_230 ^ uVar11;
  auVar14._0_8_ = (ulong)local_238 ^ local_208[0];
  auVar17._8_4_ = auStack_1f0[0];
  auVar17._12_4_ = auStack_1f0[1];
  auVar17._0_4_ = local_1f8[0];
  auVar17._4_4_ = local_1f8[1];
  auVar17 = vpand_avx(auVar14,auVar17);
  local_238 = auVar17._0_8_;
  auVar15 = local_238;
  uStack_230 = auVar17._8_8_;
  uVar11 = uStack_230;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_238;
  auVar16 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar3 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar16 = auVar16 ^ ZEXT816((ulong)0x1f7011640) << uVar1;
    }
  }
  local_238 = auVar16._0_8_;
  uStack_230 = auVar16._8_8_;
  auVar13._8_8_ = uStack_230 ^ uVar11;
  auVar13._0_8_ = (ulong)local_238 ^ (ulong)auVar15;
  auVar12._8_4_ = auStack_1e0[0];
  auVar12._12_4_ = auStack_1e0[1];
  auVar12._0_4_ = local_1e8[0];
  auVar12._4_4_ = local_1e8[1];
  auVar16 = vpand_avx(auVar13,auVar12);
  local_238 = auVar16._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_238;
  auVar4 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar10 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar4 = auVar4 ^ ZEXT816((ulong)0x1db710640) << uVar1;
    }
  }
  uStack_230._0_4_ = auVar4._8_4_ ^ auVar16._8_4_ ^ auVar17._8_4_;
  *(uint *)local_1d8[4] = (uint)uStack_230 ^ 0xffffffff;
  return (uint32_t)local_1d8[4][0];
}

Assistant:

Z_INTERNAL uint32_t CRC32_FOLD_FINAL(crc32_fold *crc) {
    const __m128i xmm_mask  = _mm_load_si128((__m128i *)crc_mask);
    const __m128i xmm_mask2 = _mm_load_si128((__m128i *)crc_mask2);
    __m128i xmm_crc0, xmm_crc1, xmm_crc2, xmm_crc3;
    __m128i x_tmp0, x_tmp1, x_tmp2, crc_fold;

    crc32_fold_load((__m128i *)crc->fold, &xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);

    /*
     * k1
     */
    crc_fold = _mm_load_si128((__m128i *)crc_k);

    x_tmp0 = _mm_clmulepi64_si128(xmm_crc0, crc_fold, 0x10);
    xmm_crc0 = _mm_clmulepi64_si128(xmm_crc0, crc_fold, 0x01);
    xmm_crc1 = _mm_xor_si128(xmm_crc1, x_tmp0);
    xmm_crc1 = _mm_xor_si128(xmm_crc1, xmm_crc0);

    x_tmp1 = _mm_clmulepi64_si128(xmm_crc1, crc_fold, 0x10);
    xmm_crc1 = _mm_clmulepi64_si128(xmm_crc1, crc_fold, 0x01);
    xmm_crc2 = _mm_xor_si128(xmm_crc2, x_tmp1);
    xmm_crc2 = _mm_xor_si128(xmm_crc2, xmm_crc1);

    x_tmp2 = _mm_clmulepi64_si128(xmm_crc2, crc_fold, 0x10);
    xmm_crc2 = _mm_clmulepi64_si128(xmm_crc2, crc_fold, 0x01);
    xmm_crc3 = _mm_xor_si128(xmm_crc3, x_tmp2);
    xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_crc2);

    /*
     * k5
     */
    crc_fold = _mm_load_si128((__m128i *)(crc_k + 4));

    xmm_crc0 = xmm_crc3;
    xmm_crc3 = _mm_clmulepi64_si128(xmm_crc3, crc_fold, 0);
    xmm_crc0 = _mm_srli_si128(xmm_crc0, 8);
    xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_crc0);

    xmm_crc0 = xmm_crc3;
    xmm_crc3 = _mm_slli_si128(xmm_crc3, 4);
    xmm_crc3 = _mm_clmulepi64_si128(xmm_crc3, crc_fold, 0x10);
    xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_crc0);
    xmm_crc3 = _mm_and_si128(xmm_crc3, xmm_mask2);

    /*
     * k7
     */
    xmm_crc1 = xmm_crc3;
    xmm_crc2 = xmm_crc3;
    crc_fold = _mm_load_si128((__m128i *)(crc_k + 8));

    xmm_crc3 = _mm_clmulepi64_si128(xmm_crc3, crc_fold, 0);
    xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_crc2);
    xmm_crc3 = _mm_and_si128(xmm_crc3, xmm_mask);

    xmm_crc2 = xmm_crc3;
    xmm_crc3 = _mm_clmulepi64_si128(xmm_crc3, crc_fold, 0x10);
    xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_crc2);
    xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_crc1);

    crc->value = ~((uint32_t)_mm_extract_epi32(xmm_crc3, 2));

    return crc->value;
}